

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

void google::SetArgv(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = _DAT_001d2148;
  if (SetArgv(int,char_const**)::called_set_argv == '\0') {
    SetArgv(int,char_const**)::called_set_argv = '\x01';
    if (argc < 1) {
      __assert_fail("argc > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0x5d3,"void google::SetArgv(int, const char **)");
    }
    __s = *argv;
    strlen(__s);
    uVar3 = 0;
    std::__cxx11::string::_M_replace(0x1d2140,0,pcVar1,(ulong)__s);
    DAT_001d2168 = 0;
    *cmdline_abi_cxx11_ = 0;
    do {
      if (uVar3 != 0) {
        std::__cxx11::string::append((char *)&cmdline_abi_cxx11_);
      }
      std::__cxx11::string::append((char *)&cmdline_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_50,argv[uVar3],&local_51);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &argvs_abi_cxx11_,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
    argv_sum = 0;
    if (DAT_001d2168 != 0) {
      lVar2 = 0;
      argv_sum = 0;
      do {
        argv_sum = argv_sum + (char)cmdline_abi_cxx11_[lVar2];
        lVar2 = lVar2 + 1;
      } while (DAT_001d2168 != lVar2);
    }
  }
  return;
}

Assistant:

void SetArgv(int argc, const char** argv) {
  static bool called_set_argv = false;
  if (called_set_argv) return;
  called_set_argv = true;

  assert(argc > 0); // every program has at least a name
  argv0 = argv[0];

  cmdline.clear();
  for (int i = 0; i < argc; i++) {
    if (i != 0) cmdline += " ";
    cmdline += argv[i];
    argvs.push_back(argv[i]);
  }

  // Compute a simple sum of all the chars in argv
  argv_sum = 0;
  for (string::const_iterator c = cmdline.begin(); c != cmdline.end(); ++c) {
    argv_sum += *c;
  }
}